

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void cornelich::util::touch(string *path)

{
  runtime_error *this;
  string asStack_3c8 [32];
  stringstream local_3a8 [16];
  ostream local_398 [376];
  ofstream f;
  byte abStack_200 [480];
  
  std::ofstream::ofstream(&f,(path->_M_dataplus)._M_p,_S_out);
  if ((abStack_200[*(long *)(_f + -0x18)] & 5) == 0) {
    std::ofstream::~ofstream(&f);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::stringstream(local_3a8);
  std::operator<<(local_398,"Failed to create/open file ");
  std::operator<<(local_398,(string *)path);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,asStack_3c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void touch(const std::string & path)
{
    std::ofstream f(path.c_str());
    if (!f)
    {
        throw std::runtime_error(util::streamer() << "Failed to create/open file " << path);
    }
}